

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O1

void re2c::UTF8splitByContinuity(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  byte bVar1;
  uint uVar2;
  rune l_00;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = 1 < n;
  if (bVar4) {
    bVar1 = 6;
    uVar3 = 2;
    do {
      uVar2 = -1 << (bVar1 & 0x1f);
      l_00 = uVar2 & h;
      if ((uVar2 & l) != l_00) {
        if ((~uVar2 & l) == 0) {
          if ((uVar2 | h) == 0xffffffff) goto LAB_00132891;
          UTF8splitByContinuity(root,l,l_00 - 1,n);
        }
        else {
          uVar3 = ~uVar2 | l;
          UTF8splitByContinuity(root,l,uVar3,n);
          l_00 = uVar3 + 1;
        }
        UTF8splitByContinuity(root,l_00,h,n);
        if (bVar4) {
          return;
        }
        break;
      }
LAB_00132891:
      bVar4 = uVar3 < n;
      bVar1 = bVar1 + 6;
      bVar5 = uVar3 != n;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  UTF8addContinuous(root,l,h,n);
  return;
}

Assistant:

void UTF8splitByContinuity(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	for (uint32_t i = 1; i < n; ++i)
	{
		uint32_t m = (1u << (6u * i)) - 1u; // last i bytes of a UTF-8 sequence
		if ((l & ~m) != (h & ~m))
		{
			if ((l & m) != 0)
			{
				UTF8splitByContinuity(root, l, l | m, n);
				UTF8splitByContinuity(root, (l | m) + 1, h, n);
				return;
			}
			if ((h & m) != m)
			{
				UTF8splitByContinuity(root, l, (h & ~m) - 1, n);
				UTF8splitByContinuity(root, h & ~m, h, n);
				return;
			}
		}
	}
	UTF8addContinuous(root, l, h, n);
}